

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.h
# Opt level: O3

void __thiscall dlib::drawable::set_pos(drawable *this,long x,long y)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  rectangle local_48;
  
  rmutex::lock(this->m,1);
  lVar1 = (this->rect).l;
  lVar2 = (this->rect).t;
  local_48.r = (this->rect).r;
  local_48.b = (this->rect).b;
  bVar3 = lVar2 <= local_48.b;
  bVar4 = lVar1 <= local_48.r;
  lVar7 = (local_48.r - lVar1) + 1;
  if (!bVar4 || !bVar3) {
    lVar7 = 0;
  }
  lVar8 = (local_48.b - lVar2) + 1;
  if (!bVar4 || !bVar3) {
    lVar8 = 0;
  }
  (this->rect).t = y;
  (this->rect).l = x;
  lVar6 = lVar7 + x + -1;
  (this->rect).r = lVar6;
  lVar5 = lVar8 + y + -1;
  (this->rect).b = lVar5;
  if (bVar4 && bVar3) {
    local_48.l = lVar1;
    local_48.t = lVar2;
    if ((y < lVar8 + y) && (x < lVar7 + x)) {
      local_48.l = x;
      if (lVar1 < x) {
        local_48.l = lVar1;
      }
      local_48.t = y;
      if (lVar2 < y) {
        local_48.t = lVar2;
      }
      if (local_48.r < lVar6) {
        local_48.r = lVar6;
      }
      if (local_48.b < lVar5) {
        local_48.b = lVar5;
      }
    }
  }
  else {
    local_48.r = (this->rect).r;
    local_48.l = (this->rect).l;
    local_48.t = (this->rect).t;
    local_48.b = (this->rect).b;
  }
  base_window::invalidate_rectangle(&this->parent->super_base_window,&local_48);
  rmutex::unlock(this->m,1);
  return;
}

Assistant:

virtual void set_pos (
            long x,
            long y
        )
        {
            m.lock();       
            rectangle old(rect);            

            const unsigned long width = rect.width();
            const unsigned long height = rect.height();
            rect.set_top(y);
            rect.set_left(x);
            rect.set_right(static_cast<long>(x+width)-1);
            rect.set_bottom(static_cast<long>(y+height)-1);
            
            parent.invalidate_rectangle(rect+old);
            m.unlock();
        }